

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseBrackets(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  undefined2 local_3a;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_38;
  undefined4 local_2c;
  
  sanityExpect(in_RSI,TOK_OP_BRACKET_OPEN);
  parseExpression(this,(Precedence)in_RSI);
  bVar1 = expect(in_RSI,TOK_BRACKET_CLOSE);
  if (!bVar1) {
    local_3a = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
    local_2c = 1;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&local_38,(SyntaxErrorCode *)&local_3a,(Position *)&local_2c);
    generateError((Parser *)&stack0xffffffffffffffd8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffd8);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr(&local_38);
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseBrackets() noexcept {
  sanityExpect(TokenType::TOK_OP_BRACKET_OPEN);

  std::unique_ptr<Expr> result(parseExpression());
  if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET,
      lexer.getCurrentToken()->getPosition()));
  }

  return result;
}